

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweep.c
# Opt level: O0

Gia_Man_t * Gia_ManDupWithBoxes(Gia_Man_t *p,int fSeq)

{
  Tim_Man_t *p_00;
  int iVar1;
  int iVar2;
  int iVar3;
  Gia_Man_t *p_01;
  char *pcVar4;
  Gia_Obj_t *pGVar5;
  Vec_Int_t *pVVar6;
  void *pvVar7;
  Gia_Man_t *pGVar8;
  bool bVar9;
  int local_58;
  int nMarked;
  int iShift;
  int k;
  int i;
  int nBoxOuts;
  int nBoxIns;
  int curCo;
  int curCi;
  Vec_Int_t *vBoxesLeft;
  Gia_Obj_t *pObj;
  Gia_Man_t *pNew;
  Tim_Man_t *pManTime;
  int fSeq_local;
  Gia_Man_t *p_local;
  
  p_00 = (Tim_Man_t *)p->pManTime;
  iVar1 = Gia_ManBoxNum(p);
  if (iVar1 < 1) {
    __assert_fail("Gia_ManBoxNum(p) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                  ,0x84,"Gia_Man_t *Gia_ManDupWithBoxes(Gia_Man_t *, int)");
  }
  Gia_ManMarkSeqGiaWithBoxes(p,fSeq);
  iVar1 = Gia_ManObjNum(p);
  p_01 = Gia_ManStart(iVar1);
  pcVar4 = Abc_UtilStrsav(p->pName);
  p_01->pName = pcVar4;
  pcVar4 = Abc_UtilStrsav(p->pSpec);
  p_01->pSpec = pcVar4;
  pGVar5 = Gia_ManConst0(p);
  pGVar5->Value = 0;
  iShift = 1;
  while( true ) {
    bVar9 = false;
    if (iShift < p->nObjs) {
      vBoxesLeft = (Vec_Int_t *)Gia_ManObj(p,iShift);
      bVar9 = vBoxesLeft != (Vec_Int_t *)0x0;
    }
    if (!bVar9) break;
    iVar1 = Gia_ObjIsTravIdCurrent(p,(Gia_Obj_t *)vBoxesLeft);
    if (iVar1 != 0) {
      iVar1 = Gia_ObjIsCi((Gia_Obj_t *)vBoxesLeft);
      if (iVar1 == 0) {
        iVar1 = Gia_ObjIsAnd((Gia_Obj_t *)vBoxesLeft);
        if (iVar1 == 0) {
          iVar1 = Gia_ObjIsCo((Gia_Obj_t *)vBoxesLeft);
          if (iVar1 == 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                          ,0x96,"Gia_Man_t *Gia_ManDupWithBoxes(Gia_Man_t *, int)");
          }
          iVar1 = Gia_ObjFanin0Copy((Gia_Obj_t *)vBoxesLeft);
          iVar1 = Gia_ManAppendCo(p_01,iVar1);
          *(int *)&vBoxesLeft->pArray = iVar1;
        }
        else {
          iVar1 = Gia_ObjFanin0Copy((Gia_Obj_t *)vBoxesLeft);
          iVar2 = Gia_ObjFanin1Copy((Gia_Obj_t *)vBoxesLeft);
          iVar1 = Gia_ManAppendAnd(p_01,iVar1,iVar2);
          *(int *)&vBoxesLeft->pArray = iVar1;
        }
      }
      else {
        iVar1 = Gia_ManAppendCi(p_01);
        *(int *)&vBoxesLeft->pArray = iVar1;
      }
    }
    iShift = iShift + 1;
  }
  iVar1 = Gia_ManHasDangling(p_01);
  if (iVar1 != 0) {
    __assert_fail("!Gia_ManHasDangling(pNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                  ,0x98,"Gia_Man_t *Gia_ManDupWithBoxes(Gia_Man_t *, int)");
  }
  if (fSeq == 0) {
    if (p->vRegClasses != (Vec_Int_t *)0x0) {
      pVVar6 = Vec_IntDup(p->vRegClasses);
      p_01->vRegClasses = pVVar6;
    }
    if (p->vRegInits != (Vec_Int_t *)0x0) {
      pVVar6 = Vec_IntDup(p->vRegInits);
      p_01->vRegInits = pVVar6;
    }
  }
  else {
    iVar1 = Gia_ManRegBoxNum(p);
    pVVar6 = Vec_IntAlloc(iVar1);
    p_01->vRegClasses = pVVar6;
    if (p->vRegInits != (Vec_Int_t *)0x0) {
      iVar1 = Gia_ManRegBoxNum(p);
      pVVar6 = Vec_IntAlloc(iVar1);
      p_01->vRegInits = pVVar6;
    }
    iVar1 = Gia_ManPoNum(p);
    iVar2 = Gia_ManRegBoxNum(p);
    for (iShift = 0; iVar3 = Gia_ManRegBoxNum(p), iShift < iVar3; iShift = iShift + 1) {
      pGVar5 = Gia_ManCo(p,(iVar1 - iVar2) + iShift);
      iVar3 = Gia_ObjIsTravIdCurrent(p,pGVar5);
      if (iVar3 != 0) {
        pVVar6 = p_01->vRegClasses;
        iVar3 = Vec_IntEntry(p->vRegClasses,iShift);
        Vec_IntPush(pVVar6,iVar3);
        if (p->vRegInits != (Vec_Int_t *)0x0) {
          pVVar6 = p_01->vRegInits;
          iVar3 = Vec_IntEntry(p->vRegInits,iShift);
          Vec_IntPush(pVVar6,iVar3);
        }
      }
    }
  }
  iVar1 = Gia_ManBoxNum(p);
  pVVar6 = Vec_IntAlloc(iVar1);
  nBoxIns = Tim_ManPiNum(p_00);
  nBoxOuts = 0;
  for (iShift = 0; iVar1 = Gia_ManBoxNum(p), iShift < iVar1; iShift = iShift + 1) {
    iVar1 = Tim_ManBoxInputNum(p_00,iShift);
    iVar2 = Tim_ManBoxOutputNum(p_00,iShift);
    local_58 = 0;
    for (nMarked = 0; nMarked < iVar1; nMarked = nMarked + 1) {
      pGVar5 = Gia_ManCo(p,nBoxOuts + nMarked);
      iVar3 = Gia_ObjIsTravIdCurrent(p,pGVar5);
      local_58 = iVar3 + local_58;
    }
    for (nMarked = 0; nMarked < iVar2; nMarked = nMarked + 1) {
      pGVar5 = Gia_ManCi(p,nBoxIns + nMarked);
      iVar3 = Gia_ObjIsTravIdCurrent(p,pGVar5);
      local_58 = iVar3 + local_58;
    }
    nBoxOuts = iVar1 + nBoxOuts;
    nBoxIns = iVar2 + nBoxIns;
    if ((local_58 != 0) && (local_58 != iVar1 + iVar2)) {
      __assert_fail("nMarked == 0 || nMarked == nBoxIns + nBoxOuts",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                    ,0xbf,"Gia_Man_t *Gia_ManDupWithBoxes(Gia_Man_t *, int)");
    }
    if (local_58 != 0) {
      Vec_IntPush(pVVar6,iShift);
    }
  }
  iVar1 = Tim_ManPoNum(p_00);
  iVar2 = Gia_ManCiNum(p);
  if (nBoxIns != iVar2) {
    __assert_fail("curCi == Gia_ManCiNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                  ,0xc4,"Gia_Man_t *Gia_ManDupWithBoxes(Gia_Man_t *, int)");
  }
  iVar2 = Gia_ManCoNum(p);
  if (iVar1 + nBoxOuts != iVar2) {
    __assert_fail("curCo == Gia_ManCoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                  ,0xc5,"Gia_Man_t *Gia_ManDupWithBoxes(Gia_Man_t *, int)");
  }
  iVar1 = Gia_ManRegBoxNum(p);
  iVar2 = Gia_ManRegBoxNum(p_01);
  pvVar7 = Gia_ManUpdateTimMan2(p,pVVar6,iVar1 - iVar2);
  p_01->pManTime = pvVar7;
  if (p->pAigExtra == (Gia_Man_t *)0x0) {
    __assert_fail("p->pAigExtra != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                  ,0xc9,"Gia_Man_t *Gia_ManDupWithBoxes(Gia_Man_t *, int)");
  }
  if (p_01->pAigExtra != (Gia_Man_t *)0x0) {
    __assert_fail("pNew->pAigExtra == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                  ,0xca,"Gia_Man_t *Gia_ManDupWithBoxes(Gia_Man_t *, int)");
  }
  pGVar8 = Gia_ManUpdateExtraAig2(p->pManTime,p->pAigExtra,pVVar6);
  p_01->pAigExtra = pGVar8;
  iVar1 = Gia_ManCiNum(p_01);
  iVar2 = Tim_ManPiNum((Tim_Man_t *)p_01->pManTime);
  iVar3 = Gia_ManCoNum(p_01->pAigExtra);
  if (iVar1 != iVar2 + iVar3) {
    __assert_fail("Gia_ManCiNum(pNew) == Tim_ManPiNum((Tim_Man_t*)pNew->pManTime) + Gia_ManCoNum(pNew->pAigExtra)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                  ,0xcc,"Gia_Man_t *Gia_ManDupWithBoxes(Gia_Man_t *, int)");
  }
  Vec_IntFree(pVVar6);
  p_01->nAnd2Delay = p->nAnd2Delay;
  return p_01;
}

Assistant:

Gia_Man_t * Gia_ManDupWithBoxes( Gia_Man_t * p, int fSeq )
{
    Tim_Man_t * pManTime = (Tim_Man_t *)p->pManTime;
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    Vec_Int_t * vBoxesLeft;
    int curCi, curCo, nBoxIns, nBoxOuts;
    int i, k, iShift, nMarked;
    assert( Gia_ManBoxNum(p) > 0 );
    // mark useful boxes
    Gia_ManMarkSeqGiaWithBoxes( p, fSeq );
    // duplicate marked entries
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( !Gia_ObjIsTravIdCurrent(p, pObj) )
            continue;
        if ( Gia_ObjIsCi(pObj) )
            pObj->Value = Gia_ManAppendCi(pNew);
        else if ( Gia_ObjIsAnd(pObj) )
            pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else if ( Gia_ObjIsCo(pObj) )
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
        else assert( 0 );
    }
    assert( !Gia_ManHasDangling(pNew) );
    // collect remaining flops
    if ( fSeq )
    {
        pNew->vRegClasses = Vec_IntAlloc( Gia_ManRegBoxNum(p) );
        if ( p->vRegInits )
            pNew->vRegInits = Vec_IntAlloc( Gia_ManRegBoxNum(p) );
        iShift = Gia_ManPoNum(p) - Gia_ManRegBoxNum(p);
        for ( i = 0; i < Gia_ManRegBoxNum(p); i++ )
            if ( Gia_ObjIsTravIdCurrent(p, Gia_ManCo(p, iShift + i)) )
            {
                Vec_IntPush( pNew->vRegClasses, Vec_IntEntry(p->vRegClasses, i) );
                if ( p->vRegInits )
                    Vec_IntPush( pNew->vRegInits, Vec_IntEntry(p->vRegInits, i) );
            }
    }
    else 
    {
        if ( p->vRegClasses )
            pNew->vRegClasses = Vec_IntDup( p->vRegClasses );
        if ( p->vRegInits )
            pNew->vRegInits = Vec_IntDup( p->vRegInits );
    }
    // collect remaining boxes
    vBoxesLeft = Vec_IntAlloc( Gia_ManBoxNum(p) );
    curCi = Tim_ManPiNum(pManTime);
    curCo = 0;
    for ( i = 0; i < Gia_ManBoxNum(p); i++ )
    {
        nBoxIns = Tim_ManBoxInputNum(pManTime, i);
        nBoxOuts = Tim_ManBoxOutputNum(pManTime, i);
        nMarked = 0;
        for ( k = 0; k < nBoxIns; k++ )
            nMarked += Gia_ObjIsTravIdCurrent( p, Gia_ManCo(p, curCo + k) );
        for ( k = 0; k < nBoxOuts; k++ )
            nMarked += Gia_ObjIsTravIdCurrent( p, Gia_ManCi(p, curCi + k) );
        curCo += nBoxIns;
        curCi += nBoxOuts;
        // check presence
        assert( nMarked == 0 || nMarked == nBoxIns + nBoxOuts );
        if ( nMarked )
            Vec_IntPush( vBoxesLeft, i );
    }
    curCo += Tim_ManPoNum(pManTime);
    assert( curCi == Gia_ManCiNum(p) );
    assert( curCo == Gia_ManCoNum(p) );
    // update timing manager
    pNew->pManTime = Gia_ManUpdateTimMan2( p, vBoxesLeft, Gia_ManRegBoxNum(p) - Gia_ManRegBoxNum(pNew) );
    // update extra STG
    assert( p->pAigExtra != NULL );
    assert( pNew->pAigExtra == NULL );
    pNew->pAigExtra = Gia_ManUpdateExtraAig2( p->pManTime, p->pAigExtra, vBoxesLeft );
    assert( Gia_ManCiNum(pNew) == Tim_ManPiNum((Tim_Man_t*)pNew->pManTime) + Gia_ManCoNum(pNew->pAigExtra) );
    Vec_IntFree( vBoxesLeft );
    pNew->nAnd2Delay = p->nAnd2Delay;
    return pNew;
}